

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_psg.cpp
# Opt level: O2

void __thiscall PSG::MakeNoiseTable(PSG *this)

{
  uint uVar1;
  int i;
  long lVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  if (noisetable[0] == 0) {
    uVar1 = 0x37f1;
    for (lVar2 = 0; lVar2 != 0x800; lVar2 = lVar2 + 1) {
      uVar3 = 0;
      iVar4 = 0x20;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        uVar3 = (uVar1 & 1) + uVar3 * 2;
        uVar1 = (uVar1 << 0x10 ^ uVar1 << 0xe) & 0x10000 | (int)uVar1 >> 1;
      }
      noisetable[lVar2] = uVar3;
    }
  }
  return;
}

Assistant:

void PSG::MakeNoiseTable()
{
	if (!noisetable[0])
	{
		int noise = 14321;
		for (int i=0; i<noisetablesize; i++)
		{
			int n = 0;
			for (int j=0; j<32; j++)
			{
				n = n * 2 + (noise & 1);
				noise = (noise >> 1) | (((noise << 14) ^ (noise << 16)) & 0x10000);
			}
			noisetable[i] = n;
		}
	}
}